

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::ShortPrint
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,ostream *out)

{
  TPZCompEl *this_00;
  ostream *poVar1;
  long lVar2;
  TPZGeoEl *pTVar3;
  long lVar4;
  long lVar5;
  _List_node_base *p_Var6;
  long lVar7;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> restraints;
  TPZManVector<TPZTransform<double>,_10> tr;
  _List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> local_10a8;
  TPZManVector<TPZTransform<double>,_10> local_1090;
  
  poVar1 = std::operator<<(out,
                           "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::ShortPrint(std::ostream &) const [TGeometry = pzgeom::TPZGeoCube]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"\n\tMulti-physics element:: \n");
  TPZCompEl::Print((TPZCompEl *)this,out);
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            ((_List_node_base *)&local_10a8,this);
  if (local_10a8._M_impl._M_node._M_size != 0) {
    std::operator<<(out,"One shape restraints\n");
    p_Var6 = (_List_node_base *)&local_10a8;
    while (p_Var6 = (((_List_impl *)&p_Var6->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)&local_10a8) {
      TPZOneShapeRestraint::Print((TPZOneShapeRestraint *)(p_Var6 + 1),out);
    }
  }
  std::operator<<(out,"\n\tComputational elements within this multi-physics element: \n\n");
  lVar2 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  lVar5 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar5;
  }
  lVar7 = 0;
  for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
    poVar1 = std::operator<<(out,"Computational element belonging to the mesh ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(poVar1,":\n");
    this_00 = *(TPZCompEl **)
               ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar5);
    if (this_00 == (TPZCompEl *)0x0) {
      poVar1 = std::operator<<(out,"There is not element to computational mesh ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::operator<<(poVar1,"\n");
    }
    else {
      (**(code **)(*(long *)this_00 + 0xd0))(this_00,out);
      pTVar3 = TPZCompEl::Reference(this_00);
      if (pTVar3 != (TPZGeoEl *)0x0) {
        poVar1 = std::operator<<(out,"\tReference Index = ");
        TPZCompEl::Reference(this_00);
        std::ostream::_M_insert<long>((long)poVar1);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector(&local_1090,0);
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                  (this,&local_1090);
        poVar1 = std::operator<<(out,
                                 "\n\tAffine transformation of the multiphysics element for this computational element:"
                                );
        std::operator<<(poVar1,"\n");
        std::endl<char,std::char_traits<char>>(out);
        poVar1 = std::operator<<(out,"\t");
        ::operator<<(poVar1,(TPZTransform<double> *)
                            ((long)((local_1090.super_TPZVec<TPZTransform<double>_>.fStore)->fMult).
                                   super_TPZFMatrix<double>.fPivot.fExtAlloc + lVar7 + -0x68));
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&local_1090);
      }
    }
    lVar7 = lVar7 + 0x1a0;
    lVar5 = lVar5 + 0x10;
  }
  std::operator<<(out,
                  "---------------------------------------------------------------------------------------------------------------------------------------------------------------------------------\n"
                 );
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_10a8);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::ShortPrint(std::ostream & out) const {

    out << __PRETTY_FUNCTION__ << std::endl;
    out << "\n\tMulti-physics element:: \n";
    TPZCompEl::Print(out);

    std::list<TPZOneShapeRestraint> restraints = this->GetShapeRestraints();
    if(restraints.size())
    {
        out << "One shape restraints\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = restraints.begin(); it != restraints.end(); it++) {
            it->Print(out);
        }
    }

    out << "\n\tComputational elements within this multi-physics element: \n\n";
    int64_t nmesh  = fElementVec.size();
    for(int64_t iel = 0; iel< nmesh; iel++ ){

        out << "Computational element belonging to the mesh " << iel <<":\n";
        TPZCompEl *cel = fElementVec[iel].Element();
        if(!cel){
            out << "There is not element to computational mesh " << iel <<"\n";
            continue;
        }
        cel->ShortPrint(out);
        if(!cel->Reference()) continue;
        out << "\tReference Index = " << cel->Reference()->Index();

        TPZManVector<TPZTransform<> > tr;
        AffineTransform(tr);
        out << "\n\tAffine transformation of the multiphysics element for this computational element:"<<"\n";
        out << std::endl;
        out <<"\t" << tr[iel];
    }
    out << "---------------------------------------------------------------------------------------------------------------------------------------------------------------------------------\n";
}